

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O1

void PredictorSub5_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint32_t *puVar3;
  uint32_t *puVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  uint32_t uVar31;
  uint32_t uVar32;
  uint32_t uVar33;
  uint32_t uVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  char cVar39;
  byte bVar40;
  char cVar41;
  byte bVar42;
  char cVar43;
  byte bVar44;
  char cVar45;
  byte bVar46;
  char cVar47;
  byte bVar48;
  char cVar49;
  byte bVar50;
  char cVar51;
  byte bVar52;
  char cVar53;
  byte bVar54;
  char cVar55;
  byte bVar56;
  char cVar57;
  byte bVar58;
  char cVar59;
  byte bVar60;
  char cVar61;
  byte bVar62;
  char cVar63;
  byte bVar64;
  char cVar65;
  byte bVar66;
  char cVar67;
  byte bVar68;
  char cVar69;
  byte bVar70;
  
  uVar37 = 0;
  if (3 < num_pixels) {
    uVar36 = 0;
    do {
      puVar1 = upper + uVar36;
      bVar5 = *(byte *)((long)puVar1 + 1);
      bVar6 = *(byte *)((long)puVar1 + 2);
      bVar7 = *(byte *)((long)puVar1 + 3);
      uVar29 = puVar1[1];
      bVar8 = *(byte *)((long)puVar1 + 5);
      bVar9 = *(byte *)((long)puVar1 + 6);
      bVar10 = *(byte *)((long)puVar1 + 7);
      uVar30 = puVar1[2];
      bVar11 = *(byte *)((long)puVar1 + 9);
      bVar12 = *(byte *)((long)puVar1 + 10);
      bVar13 = *(byte *)((long)puVar1 + 0xb);
      uVar31 = puVar1[3];
      bVar14 = *(byte *)((long)puVar1 + 0xd);
      bVar15 = *(byte *)((long)puVar1 + 0xe);
      bVar16 = *(byte *)((long)puVar1 + 0xf);
      puVar3 = upper + uVar36 + 1;
      puVar4 = in + (uVar36 - 1);
      puVar2 = in + uVar36;
      cVar17 = *(char *)((long)puVar2 + 1);
      cVar18 = *(char *)((long)puVar2 + 2);
      cVar19 = *(char *)((long)puVar2 + 3);
      uVar32 = puVar2[1];
      cVar20 = *(char *)((long)puVar2 + 5);
      cVar21 = *(char *)((long)puVar2 + 6);
      cVar22 = *(char *)((long)puVar2 + 7);
      uVar33 = puVar2[2];
      cVar23 = *(char *)((long)puVar2 + 9);
      cVar24 = *(char *)((long)puVar2 + 10);
      cVar25 = *(char *)((long)puVar2 + 0xb);
      uVar34 = puVar2[3];
      cVar26 = *(char *)((long)puVar2 + 0xd);
      cVar27 = *(char *)((long)puVar2 + 0xe);
      cVar28 = *(char *)((long)puVar2 + 0xf);
      cVar39 = pavgb((byte)*puVar4,(byte)*puVar3);
      cVar41 = pavgb(*(byte *)((long)puVar4 + 1),*(byte *)((long)puVar3 + 1));
      cVar43 = pavgb(*(byte *)((long)puVar4 + 2),*(byte *)((long)puVar3 + 2));
      cVar45 = pavgb(*(byte *)((long)puVar4 + 3),*(byte *)((long)puVar3 + 3));
      cVar47 = pavgb((byte)puVar4[1],(byte)puVar3[1]);
      cVar49 = pavgb(*(byte *)((long)puVar4 + 5),*(byte *)((long)puVar3 + 5));
      cVar51 = pavgb(*(byte *)((long)puVar4 + 6),*(byte *)((long)puVar3 + 6));
      cVar53 = pavgb(*(byte *)((long)puVar4 + 7),*(byte *)((long)puVar3 + 7));
      cVar55 = pavgb((byte)puVar4[2],(byte)puVar3[2]);
      cVar57 = pavgb(*(byte *)((long)puVar4 + 9),*(byte *)((long)puVar3 + 9));
      cVar59 = pavgb(*(byte *)((long)puVar4 + 10),*(byte *)((long)puVar3 + 10));
      cVar61 = pavgb(*(byte *)((long)puVar4 + 0xb),*(byte *)((long)puVar3 + 0xb));
      cVar63 = pavgb((byte)puVar4[3],(byte)puVar3[3]);
      cVar65 = pavgb(*(byte *)((long)puVar4 + 0xd),*(byte *)((long)puVar3 + 0xd));
      cVar67 = pavgb(*(byte *)((long)puVar4 + 0xe),*(byte *)((long)puVar3 + 0xe));
      cVar69 = pavgb(*(byte *)((long)puVar4 + 0xf),*(byte *)((long)puVar3 + 0xf));
      bVar40 = cVar39 - (((byte)*puVar3 ^ (byte)*puVar4) & 1);
      bVar42 = cVar41 - ((*(byte *)((long)puVar3 + 1) ^ *(byte *)((long)puVar4 + 1)) & 1);
      bVar44 = cVar43 - ((*(byte *)((long)puVar3 + 2) ^ *(byte *)((long)puVar4 + 2)) & 1);
      bVar46 = cVar45 - ((*(byte *)((long)puVar3 + 3) ^ *(byte *)((long)puVar4 + 3)) & 1);
      bVar48 = cVar47 - (((byte)puVar3[1] ^ (byte)puVar4[1]) & 1);
      bVar50 = cVar49 - ((*(byte *)((long)puVar3 + 5) ^ *(byte *)((long)puVar4 + 5)) & 1);
      bVar52 = cVar51 - ((*(byte *)((long)puVar3 + 6) ^ *(byte *)((long)puVar4 + 6)) & 1);
      bVar54 = cVar53 - ((*(byte *)((long)puVar3 + 7) ^ *(byte *)((long)puVar4 + 7)) & 1);
      bVar56 = cVar55 - (((byte)puVar3[2] ^ (byte)puVar4[2]) & 1);
      bVar58 = cVar57 - ((*(byte *)((long)puVar3 + 9) ^ *(byte *)((long)puVar4 + 9)) & 1);
      bVar60 = cVar59 - ((*(byte *)((long)puVar3 + 10) ^ *(byte *)((long)puVar4 + 10)) & 1);
      bVar62 = cVar61 - ((*(byte *)((long)puVar3 + 0xb) ^ *(byte *)((long)puVar4 + 0xb)) & 1);
      bVar64 = cVar63 - (((byte)puVar3[3] ^ (byte)puVar4[3]) & 1);
      bVar66 = cVar65 - ((*(byte *)((long)puVar3 + 0xd) ^ *(byte *)((long)puVar4 + 0xd)) & 1);
      bVar68 = cVar67 - ((*(byte *)((long)puVar3 + 0xe) ^ *(byte *)((long)puVar4 + 0xe)) & 1);
      bVar70 = cVar69 - ((*(byte *)((long)puVar3 + 0xf) ^ *(byte *)((long)puVar4 + 0xf)) & 1);
      cVar39 = pavgb(bVar40,(byte)*puVar1);
      cVar41 = pavgb(bVar42,bVar5);
      cVar43 = pavgb(bVar44,bVar6);
      cVar45 = pavgb(bVar46,bVar7);
      cVar47 = pavgb(bVar48,(byte)uVar29);
      cVar49 = pavgb(bVar50,bVar8);
      cVar51 = pavgb(bVar52,bVar9);
      cVar53 = pavgb(bVar54,bVar10);
      cVar55 = pavgb(bVar56,(byte)uVar30);
      cVar57 = pavgb(bVar58,bVar11);
      cVar59 = pavgb(bVar60,bVar12);
      cVar61 = pavgb(bVar62,bVar13);
      cVar63 = pavgb(bVar64,(byte)uVar31);
      cVar65 = pavgb(bVar66,bVar14);
      cVar67 = pavgb(bVar68,bVar15);
      cVar69 = pavgb(bVar70,bVar16);
      puVar3 = out + uVar36;
      *(byte *)puVar3 = ((bVar40 ^ (byte)*puVar1) & 1) + ((char)*puVar2 - cVar39);
      *(byte *)((long)puVar3 + 1) = ((bVar42 ^ bVar5) & 1) + (cVar17 - cVar41);
      *(byte *)((long)puVar3 + 2) = ((bVar44 ^ bVar6) & 1) + (cVar18 - cVar43);
      *(byte *)((long)puVar3 + 3) = ((bVar46 ^ bVar7) & 1) + (cVar19 - cVar45);
      *(byte *)(puVar3 + 1) = ((bVar48 ^ (byte)uVar29) & 1) + ((char)uVar32 - cVar47);
      *(byte *)((long)puVar3 + 5) = ((bVar50 ^ bVar8) & 1) + (cVar20 - cVar49);
      *(byte *)((long)puVar3 + 6) = ((bVar52 ^ bVar9) & 1) + (cVar21 - cVar51);
      *(byte *)((long)puVar3 + 7) = ((bVar54 ^ bVar10) & 1) + (cVar22 - cVar53);
      *(byte *)(puVar3 + 2) = ((bVar56 ^ (byte)uVar30) & 1) + ((char)uVar33 - cVar55);
      *(byte *)((long)puVar3 + 9) = ((bVar58 ^ bVar11) & 1) + (cVar23 - cVar57);
      *(byte *)((long)puVar3 + 10) = ((bVar60 ^ bVar12) & 1) + (cVar24 - cVar59);
      *(byte *)((long)puVar3 + 0xb) = ((bVar62 ^ bVar13) & 1) + (cVar25 - cVar61);
      *(byte *)(puVar3 + 3) = ((bVar64 ^ (byte)uVar31) & 1) + ((char)uVar34 - cVar63);
      *(byte *)((long)puVar3 + 0xd) = ((bVar66 ^ bVar14) & 1) + (cVar26 - cVar65);
      *(byte *)((long)puVar3 + 0xe) = ((bVar68 ^ bVar15) & 1) + (cVar27 - cVar67);
      *(byte *)((long)puVar3 + 0xf) = ((bVar70 ^ bVar16) & 1) + (cVar28 - cVar69);
      uVar37 = uVar36 + 4;
      uVar38 = uVar36 + 8;
      uVar36 = uVar37;
    } while (uVar38 <= (uint)num_pixels);
  }
  iVar35 = num_pixels - (int)uVar37;
  if (iVar35 == 0) {
    return;
  }
  uVar37 = uVar37 & 0xffffffff;
  (*VP8LPredictorsSub_C[5])(in + uVar37,upper + uVar37,iVar35,out + uVar37);
  return;
}

Assistant:

static void PredictorSub5_SSE2(const uint32_t* in, const uint32_t* upper,
                               int num_pixels, uint32_t* out) {
  int i;
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i L = _mm_loadu_si128((const __m128i*)&in[i - 1]);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i TR = _mm_loadu_si128((const __m128i*)&upper[i + 1]);
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    __m128i avg, pred, res;
    Average2_m128i(&L, &TR, &avg);
    Average2_m128i(&avg, &T, &pred);
    res = _mm_sub_epi8(src, pred);
    _mm_storeu_si128((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[5](in + i, upper + i, num_pixels - i, out + i);
  }
}